

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_list.c
# Opt level: O3

ngx_list_t * ngx_list_create(ngx_pool_t *pool,ngx_uint_t n,size_t size)

{
  ngx_list_t *pnVar1;
  void *pvVar2;
  
  pnVar1 = (ngx_list_t *)ngx_palloc(pool,0x38);
  if (pnVar1 != (ngx_list_t *)0x0) {
    pvVar2 = ngx_palloc(pool,size * n);
    (pnVar1->part).elts = pvVar2;
    if (pvVar2 != (void *)0x0) {
      (pnVar1->part).nelts = 0;
      (pnVar1->part).next = (ngx_list_part_t *)0x0;
      pnVar1->last = &pnVar1->part;
      pnVar1->size = size;
      pnVar1->nalloc = n;
      pnVar1->pool = pool;
      return pnVar1;
    }
  }
  return (ngx_list_t *)0x0;
}

Assistant:

ngx_list_t *
ngx_list_create(ngx_pool_t *pool, ngx_uint_t n, size_t size)
{
    ngx_list_t  *list;

    list = ngx_palloc(pool, sizeof(ngx_list_t));
    if (list == NULL) {
        return NULL;
    }

    if (ngx_list_init(list, pool, n, size) != NGX_OK) {
        return NULL;
    }

    return list;
}